

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

int fd_close(hFILE *fpv)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int ret;
  hFILE_fd *fp;
  hFILE *fpv_local;
  
  do {
    iVar1 = close(*(int *)&fpv[1].buffer);
    bVar3 = false;
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return iVar1;
}

Assistant:

static int fd_close(hFILE *fpv)
{
    hFILE_fd *fp = (hFILE_fd *) fpv;
    int ret;
    do {
#ifdef HAVE_CLOSESOCKET
        ret = fp->is_socket? closesocket(fp->fd) : close(fp->fd);
#else
        ret = close(fp->fd);
#endif
    } while (ret < 0 && errno == EINTR);
    return ret;
}